

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr.c
# Opt level: O3

void add_action(Grammar *g,State *s,uint akind,Term *aterm,Rule *arule,State *astate)

{
  uint uVar1;
  ulong uVar2;
  Action *pAVar3;
  Action **ppAVar4;
  VecAction *v;
  ulong uVar5;
  Action **ppAVar6;
  
  if (akind == 2) {
    uVar2 = (ulong)(s->reduce_actions).n;
    if (uVar2 != 0) {
      uVar5 = 0;
      do {
        if ((s->reduce_actions).v[uVar5]->rule == arule) {
          return;
        }
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
    pAVar3 = new_Action(g,2,aterm,arule,astate);
    ppAVar4 = (s->reduce_actions).v;
    ppAVar6 = (s->reduce_actions).e;
    if (ppAVar4 == (Action **)0x0) {
      (s->reduce_actions).v = ppAVar6;
      uVar1 = (s->reduce_actions).n;
      (s->reduce_actions).n = uVar1 + 1;
      (s->reduce_actions).e[uVar1] = pAVar3;
      return;
    }
    v = &s->reduce_actions;
  }
  else {
    uVar2 = (ulong)(s->shift_actions).n;
    if (uVar2 != 0) {
      uVar5 = 0;
      do {
        pAVar3 = (s->shift_actions).v[uVar5];
        if (((pAVar3->term == aterm) && (pAVar3->state == astate)) && (pAVar3->kind == ACTION_SHIFT)
           ) {
          return;
        }
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
    pAVar3 = new_Action(g,1,aterm,arule,astate);
    ppAVar4 = (s->shift_actions).v;
    ppAVar6 = (s->shift_actions).e;
    if (ppAVar4 == (Action **)0x0) {
      (s->shift_actions).v = ppAVar6;
      uVar1 = (s->shift_actions).n;
      (s->shift_actions).n = uVar1 + 1;
      (s->shift_actions).e[uVar1] = pAVar3;
      return;
    }
    v = &s->shift_actions;
  }
  uVar1 = v->n;
  if (ppAVar4 == ppAVar6) {
    if (2 < uVar1) goto LAB_001401bc;
  }
  else if ((uVar1 & 7) == 0) {
LAB_001401bc:
    vec_add_internal(v,pAVar3);
    return;
  }
  v->n = uVar1 + 1;
  ppAVar4[uVar1] = pAVar3;
  return;
}

Assistant:

static void add_action(Grammar *g, State *s, uint akind, Term *aterm, Rule *arule, State *astate) {
  uint i;
  Action *a;

  if (akind == ACTION_REDUCE) {
    /* eliminate duplicates */
    for (i = 0; i < s->reduce_actions.n; i++)
      if (s->reduce_actions.v[i]->rule == arule) return;
    a = new_Action(g, akind, aterm, arule, astate);
    vec_add(&s->reduce_actions, a);
  } else {
    /* eliminate duplicates */
    for (i = 0; i < s->shift_actions.n; i++)
      if (s->shift_actions.v[i]->term == aterm && s->shift_actions.v[i]->state == astate &&
          s->shift_actions.v[i]->kind == akind)
        return;
    a = new_Action(g, akind, aterm, arule, astate);
    vec_add(&s->shift_actions, a);
  }
}